

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

bool __thiscall
cmake::SetCacheArgs(cmake *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
  *this_00;
  size_type sVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  CacheEntryType CVar5;
  long lVar6;
  long lVar7;
  mapped_type *pmVar8;
  char *pcVar9;
  ostream *poVar10;
  int iVar11;
  uint uVar12;
  RegularExpression *this_01;
  mapped_type mVar13;
  pointer pbVar14;
  string *key;
  ulong local_1b0;
  string name;
  CacheEntryType type;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entriesToDelete;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cacheKeys;
  string arg;
  string entry;
  
  this_00 = &this->DiagLevels;
  local_1b0 = 1;
  bVar4 = false;
  do {
    this_01 = (RegularExpression *)&entry;
    pbVar14 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14 >> 5) <= local_1b0
       ) {
      if (!bVar4) {
        return true;
      }
      bVar4 = FindPackage(this,args);
      return bVar4;
    }
    std::__cxx11::string::string((string *)&arg,(string *)(pbVar14 + local_1b0));
    lVar6 = std::__cxx11::string::find((char *)&arg,0x48e1da);
    iVar11 = (int)local_1b0;
    if (lVar6 == 0) {
      std::__cxx11::string::substr((ulong)this_01,(ulong)&arg);
      if (entry._M_string_length == 0) {
        local_1b0 = (ulong)(iVar11 + 1);
        if (local_1b0 <
            (ulong)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 5)) {
          std::__cxx11::string::_M_assign((string *)this_01);
          goto LAB_00284954;
        }
        bVar2 = false;
        cmSystemTools::Error
                  ("-D must be followed with VAR=VALUE.",(char *)0x0,(char *)0x0,(char *)0x0);
      }
      else {
LAB_00284954:
        name._M_dataplus._M_p = (pointer)&name.field_2;
        name._M_string_length = 0;
        entriesToDelete.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&entriesToDelete.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        entriesToDelete.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        name.field_2._M_local_buf[0] = '\0';
        entriesToDelete.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)entriesToDelete.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage &
                      0xffffffffffffff00);
        type = UNINITIALIZED;
        bVar2 = cmState::ParseCacheEntry(&entry,&name,(string *)&entriesToDelete,&type);
        if (bVar2) {
          cacheKeys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)&cacheKeys.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          cacheKeys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          cacheKeys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          if ((this->WarnUnusedCli == true) &&
             (pcVar9 = cmState::GetInitializedCacheValue(this->State,&name), pcVar9 != (char *)0x0))
          {
            bVar3 = true;
            std::__cxx11::string::assign((char *)&cacheKeys);
          }
          else {
            bVar3 = false;
          }
          AddCacheEntry(this,&name,
                        (char *)entriesToDelete.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                        "No help, variable specified on the command line.",type);
          if (this->WarnUnusedCli == true) {
            if (bVar3) {
              pcVar9 = cmState::GetInitializedCacheValue(this->State,&name);
              bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&cacheKeys,pcVar9);
              if (!bVar3) goto LAB_00284c0e;
            }
            WatchUnusedCli(this,&name);
          }
LAB_00284c0e:
          std::__cxx11::string::~string((string *)&cacheKeys);
        }
        else {
          poVar10 = std::operator<<((ostream *)&std::cerr,"Parse error in command line argument: ");
          poVar10 = std::operator<<(poVar10,(string *)&arg);
          poVar10 = std::operator<<(poVar10,"\n");
          std::operator<<(poVar10,"Should be: VAR:type=value\n");
          cmSystemTools::Error("No cmake script provided.",(char *)0x0,(char *)0x0,(char *)0x0);
        }
        std::__cxx11::string::~string((string *)&entriesToDelete);
        std::__cxx11::string::~string((string *)&name);
      }
      std::__cxx11::string::~string((string *)&entry);
      if (bVar2 == false) {
        bVar2 = false;
      }
      else {
LAB_00284e95:
        bVar2 = true;
      }
    }
    else {
      bVar2 = cmHasLiteralPrefix<std::__cxx11::string,3ul>(&arg,(char (*) [3])"-W");
      if (bVar2) {
        std::__cxx11::string::substr((ulong)this_01,(ulong)&arg);
        if (entry._M_string_length == 0) {
          local_1b0 = (ulong)(iVar11 + 1);
          if (local_1b0 <
              (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5)) {
            std::__cxx11::string::_M_assign((string *)this_01);
            goto LAB_0028480e;
          }
          bVar2 = false;
          cmSystemTools::Error
                    ("-W must be followed with [no-]<name>.",(char *)0x0,(char *)0x0,(char *)0x0);
        }
        else {
LAB_0028480e:
          name._M_dataplus._M_p = (pointer)&name.field_2;
          name._M_string_length = 0;
          name.field_2._M_local_buf[0] = '\0';
          lVar6 = std::__cxx11::string::find((char *)this_01,0x47a065);
          lVar7 = std::__cxx11::string::find((char *)this_01,0x47a069);
          std::__cxx11::string::substr((ulong)&entriesToDelete,(ulong)this_01);
          std::__cxx11::string::operator=((string *)&name,(string *)&entriesToDelete);
          std::__cxx11::string::~string((string *)&entriesToDelete);
          bVar2 = name._M_string_length != 0;
          if (name._M_string_length == 0) {
            cmSystemTools::Error("No warning name provided.",(char *)0x0,(char *)0x0,(char *)0x0);
          }
          else if (lVar6 == 0 || lVar7 == 0) {
            if (lVar6 == 0 && lVar7 != 0) {
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                       ::operator[](this_00,&name);
              *pmVar8 = DIAG_IGNORE;
            }
            else {
              if ((lVar6 == 0) || (lVar7 != 0)) {
                pmVar8 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                         ::operator[](this_00,&name);
                mVar13 = *pmVar8;
                pmVar8 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                         ::operator[](this_00,&name);
                if (0 < (int)mVar13) {
                  mVar13 = DIAG_WARN;
                }
                goto LAB_00284d0f;
              }
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                       ::operator[](this_00,&name);
              *pmVar8 = DIAG_ERROR;
            }
          }
          else {
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                     ::operator[](this_00,&name);
            mVar13 = *pmVar8;
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                     ::operator[](this_00,&name);
            if ((int)mVar13 < 2) {
              mVar13 = DIAG_WARN;
            }
LAB_00284d0f:
            *pmVar8 = mVar13;
          }
          std::__cxx11::string::~string((string *)&name);
        }
        std::__cxx11::string::~string((string *)&entry);
        if (bVar2) goto LAB_00284e95;
        bVar2 = false;
      }
      else {
        lVar6 = std::__cxx11::string::find((char *)&arg,0x47a08a);
        if (lVar6 == 0) {
          std::__cxx11::string::substr((ulong)&name,(ulong)&arg);
          if (name._M_string_length == 0) {
            local_1b0 = (ulong)(iVar11 + 1);
            if (local_1b0 <
                (ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5)) {
              std::__cxx11::string::_M_assign((string *)&name);
              goto LAB_00284b20;
            }
            bVar2 = false;
            cmSystemTools::Error
                      ("-U must be followed with VAR.",(char *)0x0,(char *)0x0,(char *)0x0);
          }
          else {
LAB_00284b20:
            cmsys::Glob::PatternToRegex((string *)&entriesToDelete,&name,true,true);
            cmsys::RegularExpression::RegularExpression
                      (this_01,(char *)entriesToDelete.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
            std::__cxx11::string::~string((string *)&entriesToDelete);
            entriesToDelete.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            entriesToDelete.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            entriesToDelete.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            cmState::GetCacheEntryKeys_abi_cxx11_(&cacheKeys,this->State);
            for (pbVar14 = cacheKeys.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                key = entriesToDelete.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                pbVar14 !=
                cacheKeys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar14 = pbVar14 + 1) {
              CVar5 = cmState::GetCacheEntryType(this->State,pbVar14);
              if ((CVar5 != STATIC) &&
                 (bVar2 = cmsys::RegularExpression::find(this_01,(pbVar14->_M_dataplus)._M_p), bVar2
                 )) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&entriesToDelete,pbVar14);
              }
            }
            for (; key != entriesToDelete.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish; key = key + 1) {
              cmState::RemoveCacheEntry(this->State,key);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&cacheKeys);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&entriesToDelete);
            cmsys::RegularExpression::~RegularExpression(this_01);
            bVar2 = true;
          }
          this_01 = (RegularExpression *)&name;
LAB_00284dae:
          std::__cxx11::string::~string((string *)this_01);
          uVar12 = (uint)local_1b0;
          if (bVar2) goto LAB_00284e95;
LAB_00284dbc:
          local_1b0._0_4_ = uVar12;
          bVar2 = false;
        }
        else {
          lVar6 = std::__cxx11::string::find((char *)&arg,0x47a0ab);
          if (lVar6 == 0) {
            std::__cxx11::string::substr((ulong)this_01,(ulong)&arg);
            if (entry._M_string_length == 0) {
              local_1b0 = (ulong)(iVar11 + 1);
              if (local_1b0 <
                  (ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 5)) {
                std::__cxx11::string::_M_assign((string *)this_01);
                goto LAB_00284d68;
              }
              bVar2 = false;
              cmSystemTools::Error
                        ("-C must be followed by a file name.",(char *)0x0,(char *)0x0,(char *)0x0);
            }
            else {
LAB_00284d68:
              poVar10 = std::operator<<((ostream *)&std::cout,"loading initial cache file ");
              poVar10 = std::operator<<(poVar10,(string *)this_01);
              std::operator<<(poVar10,"\n");
              bVar2 = true;
              ReadListFile(this,args,entry._M_dataplus._M_p);
            }
            goto LAB_00284dae;
          }
          lVar6 = std::__cxx11::string::find((char *)&arg,0x47a0ee);
          if (lVar6 != 0) {
            lVar6 = std::__cxx11::string::find((char *)&arg,0x47a115);
            bVar4 = (bool)(bVar4 | lVar6 == 0);
            goto LAB_00284e95;
          }
          uVar12 = iVar11 + 1;
          local_1b0 = (ulong)uVar12;
          pbVar14 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if (local_1b0 <
              (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14 >> 5)) {
            std::__cxx11::string::string((string *)this_01,(string *)(pbVar14 + local_1b0));
            sVar1 = entry._M_string_length;
            if (entry._M_string_length == 0) {
              cmSystemTools::Error("No cmake script provided.",(char *)0x0,(char *)0x0,(char *)0x0);
            }
            else {
              ReadListFile(this,args,entry._M_dataplus._M_p);
            }
            std::__cxx11::string::~string((string *)this_01);
            if (sVar1 != 0) goto LAB_00284e95;
            goto LAB_00284dbc;
          }
          bVar2 = false;
          cmSystemTools::Error
                    ("-P must be followed by a file name.",(char *)0x0,(char *)0x0,(char *)0x0);
          local_1b0._0_4_ = uVar12;
        }
      }
    }
    std::__cxx11::string::~string((string *)&arg);
    local_1b0 = (ulong)((uint)local_1b0 + 1);
    if (!bVar2) {
      return false;
    }
  } while( true );
}

Assistant:

bool cmake::SetCacheArgs(const std::vector<std::string>& args)
{
  bool findPackageMode = false;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    std::string arg = args[i];
    if(arg.find("-D",0) == 0)
      {
      std::string entry = arg.substr(2);
      if(entry.empty())
        {
        ++i;
        if(i < args.size())
          {
          entry = args[i];
          }
        else
          {
          cmSystemTools::Error("-D must be followed with VAR=VALUE.");
          return false;
          }
        }
      std::string var, value;
      cmState::CacheEntryType type = cmState::UNINITIALIZED;
      if(cmState::ParseCacheEntry(entry, var, value, type))
        {
        // The value is transformed if it is a filepath for example, so
        // we can't compare whether the value is already in the cache until
        // after we call AddCacheEntry.
        bool haveValue = false;
        std::string cachedValue;
        if(this->WarnUnusedCli)
          {
          if(const char *v = this->State->GetInitializedCacheValue(var))
            {
            haveValue = true;
            cachedValue = v;
            }
          }

        this->AddCacheEntry(var, value.c_str(),
          "No help, variable specified on the command line.", type);

        if(this->WarnUnusedCli)
          {
          if (!haveValue ||
              cachedValue != this->State->GetInitializedCacheValue(var))
            {
            this->WatchUnusedCli(var);
            }
          }
        }
      else
        {
        std::cerr << "Parse error in command line argument: " << arg << "\n"
                  << "Should be: VAR:type=value\n";
        cmSystemTools::Error("No cmake script provided.");
        return false;
        }
      }
    else if(cmHasLiteralPrefix(arg, "-W"))
      {
      std::string entry = arg.substr(2);
      if (entry.empty())
        {
        ++i;
        if (i < args.size())
          {
          entry = args[i];
          }
        else
          {
          cmSystemTools::Error("-W must be followed with [no-]<name>.");
          return false;
          }
        }

      std::string name;
      bool foundNo = false;
      bool foundError = false;
      unsigned int nameStartPosition = 0;

      if (entry.find("no-", nameStartPosition) == 0)
        {
        foundNo = true;
        nameStartPosition += 3;
        }

      if (entry.find("error=", nameStartPosition) == 0)
        {
        foundError = true;
        nameStartPosition += 6;
        }

      name = entry.substr(nameStartPosition);
      if (name.empty())
        {
        cmSystemTools::Error("No warning name provided.");
        return false;
        }

      if (!foundNo && !foundError)
        {
        // -W<name>
        this->DiagLevels[name] = std::max(this->DiagLevels[name],
                                          DIAG_WARN);
        }
      else if (foundNo && !foundError)
        {
         // -Wno<name>
         this->DiagLevels[name] = DIAG_IGNORE;
        }
      else if (!foundNo && foundError)
        {
        // -Werror=<name>
        this->DiagLevels[name] = DIAG_ERROR;
        }
      else
        {
        // -Wno-error=<name>
        this->DiagLevels[name] = std::min(this->DiagLevels[name],
                                          DIAG_WARN);
        }
      }
    else if(arg.find("-U",0) == 0)
      {
      std::string entryPattern = arg.substr(2);
      if(entryPattern.empty())
        {
        ++i;
        if(i < args.size())
          {
          entryPattern = args[i];
          }
        else
          {
          cmSystemTools::Error("-U must be followed with VAR.");
          return false;
          }
        }
      cmsys::RegularExpression regex(
        cmsys::Glob::PatternToRegex(entryPattern, true, true).c_str());
      //go through all cache entries and collect the vars which will be removed
      std::vector<std::string> entriesToDelete;
      std::vector<std::string> cacheKeys = this->State->GetCacheEntryKeys();
      for (std::vector<std::string>::const_iterator it = cacheKeys.begin();
            it != cacheKeys.end(); ++it)
        {
        cmState::CacheEntryType t = this->State->GetCacheEntryType(*it);
        if(t != cmState::STATIC)
          {
          if (regex.find(it->c_str()))
            {
            entriesToDelete.push_back(*it);
            }
          }
        }

      // now remove them from the cache
      for(std::vector<std::string>::const_iterator currentEntry =
          entriesToDelete.begin();
          currentEntry != entriesToDelete.end();
          ++currentEntry)
        {
        this->State->RemoveCacheEntry(*currentEntry);
        }
      }
    else if(arg.find("-C",0) == 0)
      {
      std::string path = arg.substr(2);
      if (path.empty())
        {
        ++i;
        if(i < args.size())
          {
          path = args[i];
          }
        else
          {
          cmSystemTools::Error("-C must be followed by a file name.");
          return false;
          }
        }
      std::cout << "loading initial cache file " << path << "\n";
      this->ReadListFile(args, path.c_str());
      }
    else if(arg.find("-P",0) == 0)
      {
      i++;
      if(i >= args.size())
        {
        cmSystemTools::Error("-P must be followed by a file name.");
        return false;
        }
      std::string path = args[i];
      if (path.empty())
        {
        cmSystemTools::Error("No cmake script provided.");
        return false;
        }
      this->ReadListFile(args, path.c_str());
      }
    else if (arg.find("--find-package",0) == 0)
      {
      findPackageMode = true;
      }
    }

  if (findPackageMode)
    {
    return this->FindPackage(args);
    }

  return true;
}